

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_explain_analyze.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalExplainAnalyze::GetGlobalSinkState
          (PhysicalExplainAnalyze *this,ClientContext *context)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0x78);
  *pp_Var1 = (_func_int *)0x0;
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[10] = (_func_int *)0x0;
  pp_Var1[0xb] = (_func_int *)0x0;
  pp_Var1[0xc] = (_func_int *)0x0;
  pp_Var1[0xd] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)0x0;
  pp_Var1[6] = (_func_int *)0x0;
  pp_Var1[7] = (_func_int *)0x0;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[9] = (_func_int *)0x0;
  pp_Var1[0xe] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 1) = 1;
  *(undefined1 *)(pp_Var1 + 10) = 0;
  *pp_Var1 = (_func_int *)&PTR__ExplainAnalyzeStateGlobalState_019c8af8;
  pp_Var1[0xb] = (_func_int *)(pp_Var1 + 0xd);
  pp_Var1[0xc] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 0xd) = 0;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = pp_Var1;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalExplainAnalyze::GetGlobalSinkState(ClientContext &context) const {
	return make_uniq<ExplainAnalyzeStateGlobalState>();
}